

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_2::ValidateAccessChain(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  short sVar2;
  ushort uVar3;
  uint32_t id;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int32_t iVar8;
  char *pcVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  Instruction *pIVar12;
  Instruction *pIVar13;
  ulong uVar14;
  _func_int **pp_Var15;
  spv_result_t sVar16;
  size_t sStack_290;
  int64_t cur_index;
  string instr_name;
  string local_248;
  string local_228;
  DiagnosticStream local_208;
  
  pcVar9 = spvOpcodeString((uint)*(ushort *)
                                  ((long)&(inst->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 2));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,pcVar9,(allocator<char> *)&local_248);
  std::operator+(&instr_name,"Op",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208);
  std::__cxx11::string::_M_dispose();
  bVar5 = spvOpcodeGeneratesUntypedPointer
                    ((uint)*(ushort *)
                            ((long)&(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2));
  pIVar10 = ValidationState_t::FindDef
                      (_,*(uint32_t *)
                          &(inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
  if (bVar5) {
    if ((pIVar10 == (Instruction *)0x0) || ((pIVar10->inst_).opcode != 0x1141)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&local_208,"The Result Type of ");
      std::operator<<((ostream *)&local_208,(string *)&instr_name);
      std::operator<<((ostream *)&local_208," <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                (&local_248,_,
                 *(uint32_t *)
                  ((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4));
      std::operator<<((ostream *)&local_208,(string *)&local_248);
      pcVar9 = " must be OpTypeUntypedPointerKHR. Found Op";
LAB_00592451:
      std::operator<<((ostream *)&local_208,pcVar9);
      pcVar9 = spvOpcodeString((uint)(pIVar10->inst_).opcode);
      std::operator<<((ostream *)&local_208,pcVar9);
      std::operator<<((ostream *)&local_208,".");
      std::__cxx11::string::_M_dispose();
    }
    else {
      uVar7 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar11 = ValidationState_t::FindDef(_,uVar7);
      if ((pIVar11 != (Instruction *)0x0) &&
         (((iVar8 = spvOpcodeGeneratesType((uint)(pIVar11->inst_).opcode), iVar8 != 0 &&
           (uVar1 = (pIVar11->inst_).opcode, uVar1 != 0x1141)) && (uVar1 != 0x20)))) {
        sStack_290 = 3;
        goto LAB_00592306;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      pcVar9 = "Base type must be a non-pointer type";
LAB_005922db:
      std::operator<<((ostream *)&local_208,pcVar9);
    }
  }
  else {
    if ((pIVar10 == (Instruction *)0x0) || ((pIVar10->inst_).opcode != 0x20)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::operator<<((ostream *)&local_208,"The Result Type of ");
      std::operator<<((ostream *)&local_208,(string *)&instr_name);
      std::operator<<((ostream *)&local_208," <id> ");
      ValidationState_t::getIdName_abi_cxx11_
                (&local_248,_,
                 *(uint32_t *)
                  ((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4));
      std::operator<<((ostream *)&local_208,(string *)&local_248);
      pcVar9 = " must be OpTypePointer. Found Op";
      goto LAB_00592451;
    }
    sStack_290 = 2;
LAB_00592306:
    uVar7 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,sStack_290);
    pIVar11 = ValidationState_t::FindDef(_,uVar7);
    pIVar11 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
    if ((pIVar11 != (Instruction *)0x0) &&
       (uVar1 = (pIVar11->inst_).opcode, uVar1 == 0x1141 && bVar5 || uVar1 == 0x20)) {
      puVar4 = (pIVar11->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[2] == puVar4[2]) {
        if (bVar5) {
          uVar7 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
        }
        else {
          uVar7 = puVar4[3];
        }
        pIVar11 = ValidationState_t::FindDef(_,uVar7);
        pp_Var15 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                   _vptr_IntrusiveNodeBase;
        pIVar13 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        sVar2 = *(short *)((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 2);
        uVar14 = (ulong)((sVar2 == 0x46 || sVar2 == 0x43) || (ushort)(sVar2 + 0xeeb9U) < 2);
        if ((ulong)(_->options_->universal_limits_).max_access_chain_indexes <
            (((long)pIVar13 - (long)pp_Var15 >> 2) - uVar14) - 4) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&local_208,"The number of indexes in ");
          std::operator<<((ostream *)&local_208,(string *)&instr_name);
          std::operator<<((ostream *)&local_208," may not exceed ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
          std::operator<<((ostream *)&local_208,". Found ");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
          pcVar9 = " indexes.";
        }
        else {
          for (uVar14 = uVar14 + bVar5 + 4; uVar14 < (ulong)((long)pIVar13 - (long)pp_Var15 >> 2);
              uVar14 = uVar14 + 1) {
            id = *(uint32_t *)((long)pp_Var15 + uVar14 * 4);
            pIVar12 = ValidationState_t::FindDef(_,id);
            pIVar12 = ValidationState_t::FindDef(_,(pIVar12->inst_).type_id);
            if ((pIVar12 == (Instruction *)0x0) || ((pIVar12->inst_).opcode != 0x15)) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              std::operator<<((ostream *)&local_208,"Indexes passed to ");
              std::operator<<((ostream *)&local_208,(string *)&instr_name);
              pcVar9 = " must be of type integer.";
              goto LAB_005922db;
            }
            uVar3 = (pIVar11->inst_).opcode;
            if (uVar3 < 0x1f) {
              if ((0x31800000U >> (uVar3 & 0x1f) & 1) != 0) goto LAB_005926bd;
              if (uVar3 != 0x1e) goto LAB_00592729;
              bVar6 = ValidationState_t::EvalConstantValInt64(_,id,&cur_index);
              if (!bVar6) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
                std::operator<<((ostream *)&local_208,"The <id> passed to ");
                std::operator<<((ostream *)&local_208,(string *)&instr_name);
                std::operator<<((ostream *)&local_208," to index ");
                ValidationState_t::getIdName_abi_cxx11_(&local_248,_,id);
                std::operator<<((ostream *)&local_208,(string *)&local_248);
                pcVar9 = " into a structure must be an OpConstant.";
                goto LAB_005924fe;
              }
              puVar4 = (pIVar11->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((cur_index < 0) ||
                 (((long)(pIVar11->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar4 >> 2) + -2 <= cur_index))
              {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
                std::operator<<((ostream *)&local_208,"Index ");
                ValidationState_t::getIdName_abi_cxx11_(&local_248,_,id);
                std::operator<<((ostream *)&local_208,(string *)&local_248);
                std::operator<<((ostream *)&local_208," is out of bounds: ");
                std::operator<<((ostream *)&local_208,(string *)&instr_name);
                std::operator<<((ostream *)&local_208," cannot find index ");
                std::ostream::_M_insert<long>((long)&local_208);
                std::operator<<((ostream *)&local_208," into the structure <id> ");
                ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar11->inst_).result_id);
                std::operator<<((ostream *)&local_208,(string *)&local_228);
                std::operator<<((ostream *)&local_208,". This structure has ");
                std::ostream::_M_insert<long>((long)&local_208);
                std::operator<<((ostream *)&local_208," members. Largest valid index is ");
                std::ostream::_M_insert<long>((long)&local_208);
                std::operator<<((ostream *)&local_208,".");
                std::__cxx11::string::_M_dispose();
                goto LAB_0059250d;
              }
              uVar7 = puVar4[cur_index + 2];
            }
            else {
LAB_00592729:
              if ((((uVar3 != 0x1168) && (uVar3 != 0x13d4)) && (uVar3 != 0x14ee)) &&
                 (uVar3 != 0x14a8)) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
                std::operator<<((ostream *)&local_208,(string *)&instr_name);
                pcVar9 = " reached non-composite type while indexes still remain to be traversed.";
                goto LAB_005922db;
              }
LAB_005926bd:
              uVar7 = (pIVar11->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[2];
            }
            pIVar11 = ValidationState_t::FindDef(_,uVar7);
            pp_Var15 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                       _vptr_IntrusiveNodeBase;
            pIVar13 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          }
          sVar16 = SPV_SUCCESS;
          if ((bVar5) ||
             (pIVar10 = ValidationState_t::FindDef
                                  (_,(pIVar10->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[3]),
             sVar16 = SPV_SUCCESS, (pIVar11->inst_).result_id == (pIVar10->inst_).result_id))
          goto LAB_0059251d;
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::operator<<((ostream *)&local_208,(string *)&instr_name);
          std::operator<<((ostream *)&local_208," result type (Op");
          pcVar9 = spvOpcodeString((uint)(pIVar10->inst_).opcode);
          std::operator<<((ostream *)&local_208,pcVar9);
          std::operator<<((ostream *)&local_208,
                          ") does not match the type that results from indexing into the base <id> (Op"
                         );
          pcVar9 = spvOpcodeString((uint)(pIVar11->inst_).opcode);
          std::operator<<((ostream *)&local_208,pcVar9);
          pcVar9 = ").";
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::operator<<((ostream *)&local_208,
                        "The result pointer storage class and base pointer storage class in ");
        std::operator<<((ostream *)&local_208,(string *)&instr_name);
        pcVar9 = " do not match.";
      }
      goto LAB_005922db;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
    std::operator<<((ostream *)&local_208,"The Base <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&local_248,_,uVar7);
    std::operator<<((ostream *)&local_208,(string *)&local_248);
    std::operator<<((ostream *)&local_208," in ");
    std::operator<<((ostream *)&local_208,(string *)&instr_name);
    pcVar9 = " instruction must be a pointer.";
LAB_005924fe:
    std::operator<<((ostream *)&local_208,pcVar9);
LAB_0059250d:
    std::__cxx11::string::_M_dispose();
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
  sVar16 = local_208.error_;
LAB_0059251d:
  std::__cxx11::string::_M_dispose();
  return sVar16;
}

Assistant:

spv_result_t ValidateAccessChain(ValidationState_t& _,
                                 const Instruction* inst) {
  std::string instr_name =
      "Op" + std::string(spvOpcodeString(static_cast<spv::Op>(inst->opcode())));

  const bool untyped_pointer = spvOpcodeGeneratesUntypedPointer(inst->opcode());

  // The result type must be OpTypePointer for regular access chains and an
  // OpTypeUntypedPointerKHR for untyped access chains.
  auto result_type = _.FindDef(inst->type_id());
  if (untyped_pointer) {
    if (!result_type ||
        spv::Op::OpTypeUntypedPointerKHR != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id())
             << " must be OpTypeUntypedPointerKHR. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  } else {
    if (!result_type || spv::Op::OpTypePointer != result_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "The Result Type of " << instr_name << " <id> "
             << _.getIdName(inst->id()) << " must be OpTypePointer. Found Op"
             << spvOpcodeString(static_cast<spv::Op>(result_type->opcode()))
             << ".";
    }
  }

  if (untyped_pointer) {
    // Base type must be a non-pointer type.
    const auto base_type = _.FindDef(inst->GetOperandAs<uint32_t>(2));
    if (!base_type || !spvOpcodeGeneratesType(base_type->opcode()) ||
        base_type->opcode() == spv::Op::OpTypePointer ||
        base_type->opcode() == spv::Op::OpTypeUntypedPointerKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Base type must be a non-pointer type";
    }
  }

  // Base must be a pointer, pointing to the base of a composite object.
  const auto base_index = untyped_pointer ? 3 : 2;
  const auto base_id = inst->GetOperandAs<uint32_t>(base_index);
  const auto base = _.FindDef(base_id);
  const auto base_type = _.FindDef(base->type_id());
  if (!base_type || !(spv::Op::OpTypePointer == base_type->opcode() ||
                      (untyped_pointer && spv::Op::OpTypeUntypedPointerKHR ==
                                              base_type->opcode()))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Base <id> " << _.getIdName(base_id) << " in " << instr_name
           << " instruction must be a pointer.";
  }

  // The result pointer storage class and base pointer storage class must match.
  // Word 2 of OpTypePointer is the Storage Class.
  auto result_type_storage_class = result_type->word(2);
  auto base_type_storage_class = base_type->word(2);
  if (result_type_storage_class != base_type_storage_class) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The result pointer storage class and base "
              "pointer storage class in "
           << instr_name << " do not match.";
  }

  // The type pointed to by OpTypePointer (word 3) must be a composite type.
  auto type_pointee = untyped_pointer
                          ? _.FindDef(inst->GetOperandAs<uint32_t>(2))
                          : _.FindDef(base_type->word(3));

  // Check Universal Limit (SPIR-V Spec. Section 2.17).
  // The number of indexes passed to OpAccessChain may not exceed 255
  // The instruction includes 4 words + N words (for N indexes)
  size_t num_indexes = inst->words().size() - 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    // In pointer access chains, the element operand is required, but not
    // counted as an index.
    --num_indexes;
  }
  const size_t num_indexes_limit =
      _.options()->universal_limits_.max_access_chain_indexes;
  if (num_indexes > num_indexes_limit) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "The number of indexes in " << instr_name << " may not exceed "
           << num_indexes_limit << ". Found " << num_indexes << " indexes.";
  }
  // Indexes walk the type hierarchy to the desired depth, potentially down to
  // scalar granularity. The first index in Indexes will select the top-level
  // member/element/component/element of the base composite. All composite
  // constituents use zero-based numbering, as described by their OpType...
  // instruction. The second index will apply similarly to that result, and so
  // on. Once any non-composite type is reached, there must be no remaining
  // (unused) indexes.
  auto starting_index = untyped_pointer ? 5 : 4;
  if (inst->opcode() == spv::Op::OpPtrAccessChain ||
      inst->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
      inst->opcode() == spv::Op::OpUntypedPtrAccessChainKHR ||
      inst->opcode() == spv::Op::OpUntypedInBoundsPtrAccessChainKHR) {
    ++starting_index;
  }
  for (size_t i = starting_index; i < inst->words().size(); ++i) {
    const uint32_t cur_word = inst->words()[i];
    // Earlier ID checks ensure that cur_word definition exists.
    auto cur_word_instr = _.FindDef(cur_word);
    // The index must be a scalar integer type (See OpAccessChain in the Spec.)
    auto index_type = _.FindDef(cur_word_instr->type_id());
    if (!index_type || spv::Op::OpTypeInt != index_type->opcode()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Indexes passed to " << instr_name
             << " must be of type integer.";
    }
    switch (type_pointee->opcode()) {
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeCooperativeVectorNV:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeNodePayloadArrayAMDX: {
        // In OpTypeMatrix, OpTypeVector, spv::Op::OpTypeCooperativeMatrixNV,
        // OpTypeCooperativeVectorNV, OpTypeArray, and OpTypeRuntimeArray, word
        // 2 is the Element Type.
        type_pointee = _.FindDef(type_pointee->word(2));
        break;
      }
      case spv::Op::OpTypeStruct: {
        // In case of structures, there is an additional constraint on the
        // index: the index must be an OpConstant.
        int64_t cur_index;
        if (!_.EvalConstantValInt64(cur_word, &cur_index)) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "The <id> passed to " << instr_name << " to index "
                 << _.getIdName(cur_word)
                 << " into a "
                    "structure must be an OpConstant.";
        }

        // The index points to the struct member we want, therefore, the index
        // should be less than the number of struct members.
        const int64_t num_struct_members =
            static_cast<int64_t>(type_pointee->words().size() - 2);
        if (cur_index >= num_struct_members || cur_index < 0) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "Index " << _.getIdName(cur_word)
                 << " is out of bounds: " << instr_name << " cannot find index "
                 << cur_index << " into the structure <id> "
                 << _.getIdName(type_pointee->id()) << ". This structure has "
                 << num_struct_members << " members. Largest valid index is "
                 << num_struct_members - 1 << ".";
        }
        // Struct members IDs start at word 2 of OpTypeStruct.
        const size_t word_index = static_cast<size_t>(cur_index) + 2;
        auto structMemberId = type_pointee->word(word_index);
        type_pointee = _.FindDef(structMemberId);
        break;
      }
      default: {
        // Give an error. reached non-composite type while indexes still remain.
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << instr_name
               << " reached non-composite type while indexes "
                  "still remain to be traversed.";
      }
    }
  }

  if (!untyped_pointer) {
    // Result type is a pointer. Find out what it's pointing to.
    // This will be used to make sure the indexing results in the same type.
    // OpTypePointer word 3 is the type being pointed to.
    const auto result_type_pointee = _.FindDef(result_type->word(3));
    // At this point, we have fully walked down from the base using the indeces.
    // The type being pointed to should be the same as the result type.
    if (type_pointee->id() != result_type_pointee->id()) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << instr_name << " result type (Op"
             << spvOpcodeString(
                    static_cast<spv::Op>(result_type_pointee->opcode()))
             << ") does not match the type that results from indexing into the "
                "base "
                "<id> (Op"
             << spvOpcodeString(static_cast<spv::Op>(type_pointee->opcode()))
             << ").";
    }
  }

  return SPV_SUCCESS;
}